

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c,SUNMatrix A)

{
  int sparsetype;
  sunindextype *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  long *__ptr;
  SUNMatrix A_00;
  long *__ptr_00;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long *plVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  
  psVar1 = (sunindextype *)A->content;
  sparsetype = (int)psVar1[5];
  lVar17 = psVar1[sparsetype == 0];
  lVar10 = psVar1[sparsetype != 0];
  lVar2 = psVar1[7];
  lVar3 = psVar1[6];
  lVar4 = psVar1[4];
  lVar8 = lVar17;
  if (lVar10 < lVar17) {
    lVar8 = lVar10;
  }
  lVar19 = 0;
  if (lVar8 < 1) {
    lVar8 = lVar19;
  }
  lVar9 = 0;
  do {
    if (lVar9 == lVar8) {
      if (lVar19 == 0) {
        lVar17 = 0;
        while (lVar10 = lVar17, lVar10 != lVar8) {
          lVar9 = *(long *)(lVar2 + 8 + lVar10 * 8);
          for (lVar19 = *(long *)(lVar2 + lVar10 * 8); lVar17 = lVar10 + 1, lVar19 < lVar9;
              lVar19 = lVar19 + 1) {
            dVar22 = *(double *)(lVar4 + lVar19 * 8) * c;
            dVar23 = dVar22 + 1.0;
            if (*(long *)(lVar3 + lVar19 * 8) != lVar10) {
              dVar23 = dVar22;
            }
            *(double *)(lVar4 + lVar19 * 8) = dVar23;
          }
        }
      }
      else {
        lVar8 = *(long *)(lVar2 + lVar17 * 8);
        lVar9 = psVar1[2];
        __ptr = (long *)malloc(lVar10 * 8);
        if (lVar9 - lVar8 < lVar19) {
          A_00 = SUNSparseMatrix(*psVar1,psVar1[1],lVar8 + lVar19,sparsetype,A->sunctx);
          pvVar5 = A_00->content;
          lVar8 = *(long *)((long)pvVar5 + 0x38);
          lVar19 = *(long *)((long)pvVar5 + 0x20);
          lVar9 = *(long *)((long)pvVar5 + 0x30);
          lVar11 = 0;
          lVar13 = 0;
          if (0 < lVar17) {
            lVar13 = lVar17;
          }
          lVar18 = 0;
          while (lVar18 != lVar13) {
            *(long *)(lVar8 + lVar18 * 8) = lVar11;
            __ptr[lVar18] = 0;
            lVar21 = *(long *)(lVar2 + 8 + lVar18 * 8);
            lVar12 = lVar18 + 1;
            lVar16 = *(long *)(lVar2 + lVar18 * 8);
            for (lVar20 = lVar16; lVar20 < lVar21; lVar20 = lVar20 + 1) {
              __ptr[*(long *)(lVar3 + lVar20 * 8)] = (long)(*(double *)(lVar4 + lVar20 * 8) * c);
            }
            if (lVar18 < lVar10) {
              __ptr[lVar18] = (long)((double)__ptr[lVar18] + 1.0);
            }
            for (; lVar16 < lVar21; lVar16 = lVar16 + 1) {
              lVar21 = *(long *)(lVar3 + lVar16 * 8);
              if (lVar18 <= lVar21) {
                if (lVar21 == lVar18) goto LAB_00150e64;
                break;
              }
              *(long *)(lVar9 + lVar11 * 8) = lVar21;
              *(long *)(lVar19 + lVar11 * 8) = __ptr[*(long *)(lVar3 + lVar16 * 8)];
              lVar11 = lVar11 + 1;
              lVar21 = *(long *)(lVar2 + lVar12 * 8);
            }
            *(long *)(lVar9 + lVar11 * 8) = lVar18;
            *(long *)(lVar19 + lVar11 * 8) = __ptr[lVar18];
            lVar11 = lVar11 + 1;
LAB_00150e64:
            for (; lVar18 = lVar12, lVar16 < *(long *)(lVar2 + lVar12 * 8); lVar16 = lVar16 + 1) {
              lVar18 = *(long *)(lVar3 + lVar16 * 8);
              *(long *)(lVar9 + lVar11 * 8) = lVar18;
              *(long *)(lVar19 + lVar11 * 8) = __ptr[lVar18];
              lVar11 = lVar11 + 1;
            }
          }
          *(long *)(lVar8 + lVar17 * 8) = lVar11;
          pvVar7 = A->content;
          *(undefined8 *)((long)pvVar7 + 0x10) = *(undefined8 *)((long)pvVar5 + 0x10);
          free(*(void **)((long)pvVar7 + 0x20));
          pvVar5 = A_00->content;
          pvVar7 = A->content;
          *(undefined8 *)((long)pvVar7 + 0x20) = *(undefined8 *)((long)pvVar5 + 0x20);
          *(undefined8 *)((long)pvVar5 + 0x20) = 0;
          free(*(void **)((long)pvVar7 + 0x30));
          pvVar5 = A_00->content;
          pvVar7 = A->content;
          *(undefined8 *)((long)pvVar7 + 0x30) = *(undefined8 *)((long)pvVar5 + 0x30);
          *(undefined8 *)((long)pvVar5 + 0x30) = 0;
          free(*(void **)((long)pvVar7 + 0x38));
          pvVar5 = A_00->content;
          *(undefined8 *)((long)A->content + 0x38) = *(undefined8 *)((long)pvVar5 + 0x38);
          *(undefined8 *)((long)pvVar5 + 0x38) = 0;
          SUNMatDestroy_Sparse(A_00);
          __ptr_00 = __ptr;
        }
        else {
          __ptr_00 = (long *)malloc(lVar10 * 8);
          lVar19 = lVar19 + lVar8;
          *(long *)(lVar2 + lVar17 * 8) = lVar19;
          while (0 < lVar17) {
            lVar9 = lVar17 + -1;
            __ptr_00[lVar9] = 0;
            uVar6 = *(ulong *)(lVar2 + lVar9 * 8);
            plVar14 = __ptr;
            for (uVar15 = uVar6; (long)uVar15 < lVar8; uVar15 = uVar15 + 1) {
              lVar13 = *(long *)(lVar3 + uVar15 * 8);
              *plVar14 = lVar13;
              __ptr_00[lVar13] = (long)(*(double *)(lVar4 + uVar15 * 8) * c);
              plVar14 = plVar14 + 1;
            }
            if (lVar17 <= lVar10) {
              __ptr_00[lVar9] = (long)((double)__ptr_00[lVar9] + 1.0);
            }
            lVar13 = lVar4 + -8 + lVar19 * 8;
            lVar11 = lVar3 + -8 + lVar19 * 8;
            for (lVar18 = 0; lVar12 = ~uVar6 + lVar8 + lVar18, -1 < lVar12; lVar18 = lVar18 + -1) {
              lVar16 = __ptr[(lVar8 + lVar18 + -1) - uVar6];
              if (lVar16 < lVar17) {
                if (lVar16 == lVar9) {
                  lVar19 = lVar19 + lVar18;
                  goto LAB_00151002;
                }
                break;
              }
              *(long *)(lVar11 + lVar18 * 8) = lVar16;
              *(long *)(lVar13 + lVar18 * 8) = __ptr_00[lVar16];
            }
            lVar19 = lVar19 + lVar18 + -1;
            *(long *)(lVar11 + lVar18 * 8) = lVar9;
            *(long *)(lVar13 + lVar18 * 8) = __ptr_00[lVar9];
LAB_00151002:
            for (; -1 < lVar12; lVar12 = lVar12 + -1) {
              lVar17 = __ptr[lVar12];
              *(long *)(lVar3 + -8 + lVar19 * 8) = lVar17;
              *(long *)(lVar4 + -8 + lVar19 * 8) = __ptr_00[lVar17];
              lVar19 = lVar19 + -1;
            }
            lVar8 = *(long *)(lVar2 + lVar9 * 8);
            *(long *)(lVar2 + lVar9 * 8) = lVar19;
            lVar17 = lVar9;
          }
          free(__ptr);
        }
        free(__ptr_00);
      }
      return 0;
    }
    lVar13 = *(long *)(lVar2 + 8 + lVar9 * 8);
    lVar11 = *(long *)(lVar2 + lVar9 * 8);
    do {
      lVar18 = lVar11;
      if (lVar13 <= lVar18) break;
      lVar11 = lVar18 + 1;
    } while (*(long *)(lVar3 + lVar18 * 8) != lVar9);
    lVar19 = lVar19 + (ulong)(lVar13 <= lVar18);
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

SUNErrCode SUNMatScaleAddI_Sparse(sunrealtype c, SUNMatrix A)
{
  sunindextype j, i, p, nz, newvals, M, N, cend, nw;
  sunbooleantype newmat, found;
  sunindextype *w, *Ap, *Ai, *Cp, *Ci;
  sunrealtype *x, *Ax, *Cx;
  SUNMatrix C;
  SUNFunctionBegin(A->sunctx);

  /* store shortcuts to matrix dimensions (M is inner dimension, N is outer) */
  if (SM_SPARSETYPE_S(A) == CSC_MAT)
  {
    M = SM_ROWS_S(A);
    N = SM_COLUMNS_S(A);
  }
  else
  {
    M = SM_COLUMNS_S(A);
    N = SM_ROWS_S(A);
  }

  /* access data arrays from A */
  Ap = NULL;
  Ai = NULL;
  Ax = NULL;
  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  /* determine if A: contains values on the diagonal (so I can just be added
     in); if not, then increment counter for extra storage that should be
     required. */
  newvals = 0;
  for (j = 0; j < SUNMIN(M, N); j++)
  {
    /* scan column (row if CSR) of A, searching for diagonal value */
    found = SUNFALSE;
    for (i = Ap[j]; i < Ap[j + 1]; i++)
    {
      if (Ai[i] == j)
      {
        found = SUNTRUE;
        break;
      }
    }
    /* if no diagonal found, increment necessary storage counter */
    if (!found) { newvals += 1; }
  }

  /* If extra nonzeros required, check whether matrix has sufficient storage
     space for new nonzero entries  (so I can be inserted into existing storage)
   */
  newmat = SUNFALSE; /* no reallocation needed */
  if (newvals > (SM_NNZ_S(A) - Ap[N])) { newmat = SUNTRUE; }

  /* perform operation based on existing/necessary structure */

  /*   case 1: A already contains a diagonal */
  if (newvals == 0)
  {
    /* iterate through columns, adding 1.0 to diagonal */
    for (j = 0; j < SUNMIN(M, N); j++)
    {
      for (i = Ap[j]; i < Ap[j + 1]; i++)
      {
        if (Ai[i] == j) { Ax[i] = ONE + c * Ax[i]; }
        else { Ax[i] = c * Ax[i]; }
      }
    }

    /*   case 2: A has sufficient storage, but does not already contain a
     * diagonal */
  }
  else if (!newmat)
  {
    /* create work arrays for nonzero row (column) indices and values in a
     * single column (row) */
    w = (sunindextype*)malloc(M * sizeof(sunindextype));
    SUNAssert(w, SUN_ERR_MALLOC_FAIL);
    x = (sunrealtype*)malloc(M * sizeof(sunrealtype));
    SUNAssert(x, SUN_ERR_MALLOC_FAIL);

    /* determine storage location where last column (row) should end */
    nz = Ap[N] + newvals;

    /* store pointer past last column (row) from original A,
       and store updated value in revised A */
    cend  = Ap[N];
    Ap[N] = nz;

    /* iterate through columns (rows) backwards */
    for (j = N - 1; j >= 0; j--)
    {
      /* reset diagonal entry, in case it's not in A */
      x[j] = ZERO;

      /* iterate down column (row) of A, collecting nonzeros */
      for (p = Ap[j], i = 0; p < cend; p++, i++)
      {
        w[i]     = Ai[p];     /* collect row (column) index */
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* NNZ in this column (row) */
      nw = cend - Ap[j];

      /* add identity to this column (row) */
      if (j < M) { x[j] += ONE; /* update value */ }

      /* fill entries of A with this column's (row's) data */
      /* fill entries past diagonal */
      for (i = nw - 1; i >= 0 && w[i] > j; i--)
      {
        Ai[--nz] = w[i];
        Ax[nz]   = x[w[i]];
      }
      /* fill diagonal if applicable */
      if (i < 0 /* empty or insert at front */ ||
          w[i] != j /* insert behind front */)
      {
        Ai[--nz] = j;
        Ax[nz]   = x[j];
      }
      /* fill entries before diagonal */
      for (; i >= 0; i--)
      {
        Ai[--nz] = w[i];
        Ax[nz]   = x[w[i]];
      }

      /* store ptr past this col (row) from orig A, update value for new A */
      cend  = Ap[j];
      Ap[j] = nz;
    }

    /* clean up */
    free(w);
    free(x);

    /*   case 3: A must be reallocated with sufficient storage */
  }
  else
  {
    /* create work array for nonzero values in a single column (row) */
    x = (sunrealtype*)malloc(M * sizeof(sunrealtype));

    /* create new matrix for sum */
    C = SUNSparseMatrix(SM_ROWS_S(A), SM_COLUMNS_S(A), Ap[N] + newvals,
                        SM_SPARSETYPE_S(A), A->sunctx);
    SUNCheckLastErr();

    /* access data from CSR structures (return if failure) */
    Cp = NULL;
    Ci = NULL;
    Cx = NULL;
    Cp = SM_INDEXPTRS_S(C);
    SUNAssert(Cp, SUN_ERR_ARG_CORRUPT);
    Ci = SM_INDEXVALS_S(C);
    SUNAssert(Ci, SUN_ERR_ARG_CORRUPT);
    Cx = SM_DATA_S(C);
    SUNAssert(Cx, SUN_ERR_ARG_CORRUPT);

    /* initialize total nonzero count */
    nz = 0;

    /* iterate through columns (rows for CSR) */
    for (j = 0; j < N; j++)
    {
      /* set current column (row) pointer to current # nonzeros */
      Cp[j] = nz;

      /* reset diagonal entry, in case it's not in A */
      x[j] = ZERO;

      /* iterate down column (along row) of A, collecting nonzeros */
      for (p = Ap[j]; p < Ap[j + 1]; p++)
      {
        x[Ai[p]] = c * Ax[p]; /* collect/scale value */
      }

      /* add identity to this column (row) */
      if (j < M) { x[j] += ONE; /* update value */ }

      /* fill entries of C with this column's (row's) data */
      /* fill entries before diagonal */
      for (p = Ap[j]; p < Ap[j + 1] && Ai[p] < j; p++)
      {
        Ci[nz]   = Ai[p];
        Cx[nz++] = x[Ai[p]];
      }
      /* fill diagonal if applicable */
      if (p >= Ap[j + 1] /* empty or insert at end */ ||
          Ai[p] != j /* insert before end */)
      {
        Ci[nz]   = j;
        Cx[nz++] = x[j];
      }
      /* fill entries past diagonal */
      for (; p < Ap[j + 1]; p++)
      {
        Ci[nz]   = Ai[p];
        Cx[nz++] = x[Ai[p]];
      }
    }

    /* indicate end of data */
    Cp[N] = nz;

    /* update A's structure with C's values; nullify C's pointers */
    SM_NNZ_S(A) = SM_NNZ_S(C);

    if (SM_DATA_S(A)) { free(SM_DATA_S(A)); }
    SM_DATA_S(A) = SM_DATA_S(C);
    SM_DATA_S(C) = NULL;

    if (SM_INDEXVALS_S(A)) { free(SM_INDEXVALS_S(A)); }
    SM_INDEXVALS_S(A) = SM_INDEXVALS_S(C);
    SM_INDEXVALS_S(C) = NULL;

    if (SM_INDEXPTRS_S(A)) { free(SM_INDEXPTRS_S(A)); }
    SM_INDEXPTRS_S(A) = SM_INDEXPTRS_S(C);
    SM_INDEXPTRS_S(C) = NULL;

    /* clean up */
    SUNMatDestroy_Sparse(C);
    free(x);
  }
  return SUN_SUCCESS;
}